

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb__splitpath_raw(char *buffer,char *path,int flag)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  
  sVar4 = strlen(path);
  pcVar11 = (char *)0x0;
  cVar1 = *path;
  pcVar7 = path;
  while (cVar1 != '\0') {
    if (cVar1 == '\\') {
      pcVar11 = pcVar7;
    }
    if (cVar1 == '/') {
      pcVar11 = pcVar7;
    }
    pcVar5 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    cVar1 = *pcVar5;
  }
  uVar9 = 0xc;
  if (flag != 8) {
    uVar9 = flag;
  }
  if ((uVar9 & 7) != 0) {
    iVar8 = (int)pcVar11 + 1;
    if (pcVar11 == (char *)0x0) {
      iVar8 = 0;
    }
    iVar8 = iVar8 - (int)path;
    if (pcVar11 == (char *)0x0) {
      iVar8 = 0;
    }
    pcVar5 = strrchr(path,0x2e);
    pcVar7 = (char *)0x0;
    if (pcVar11 <= pcVar5) {
      pcVar7 = pcVar5;
    }
    if (pcVar5 == (char *)0x0) {
      pcVar7 = pcVar5;
    }
    if (pcVar11 == (char *)0x0) {
      pcVar7 = pcVar5;
    }
    iVar3 = (int)pcVar7 - (int)path;
    if (pcVar7 == (char *)0x0) {
      iVar3 = (int)sVar4;
    }
    if ((uVar9 & 1) == 0) {
      bVar2 = true;
      iVar6 = 0;
      iVar10 = iVar8;
      if (((uVar9 & 2) == 0) && (iVar6 = 0, iVar10 = iVar3, (uVar9 & 8) != 0)) {
        iVar6 = 0;
        iVar10 = (uint)(buffer[iVar3] == '.') + iVar3;
      }
    }
    else {
      bVar2 = uVar9 != 1 || iVar8 != 0;
      iVar6 = (uint)(uVar9 == 1 && iVar8 == 0) * 2;
      iVar10 = 0;
    }
    if ((uVar9 & 2) != 0) {
      iVar8 = iVar3;
    }
    if ((uVar9 & 4) != 0) {
      iVar8 = (int)sVar4;
    }
    if ((buffer != (char *)0x0) ||
       (buffer = (char *)malloc((long)(((iVar6 + iVar8) - iVar10) + 1)), buffer != (char *)0x0)) {
      if (bVar2) {
        strncpy(buffer,path + iVar10,(long)(iVar8 - iVar10));
        buffer[iVar8 - iVar10] = '\0';
        return buffer;
      }
      buffer[2] = '\0';
      buffer[0] = '.';
      buffer[1] = '/';
      return buffer;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *stb__splitpath_raw(char *buffer, char *path, int flag)
{
   int len=0,x,y, n = (int) strlen(path), f1,f2;
   char *s = stb_strrchr2(path, '/', '\\');
   char *t = strrchr(path, '.');
   if (s && t && t < s) t = NULL;
   if (s) ++s;

   if (flag == STB_EXT_NO_PERIOD)
      flag |= STB_EXT;

   if (!(flag & (STB_PATH | STB_FILE | STB_EXT))) return NULL;

   f1 = s == NULL ? 0 : s-path; // start of filename
   f2 = t == NULL ? n : t-path; // just past end of filename

   if (flag & STB_PATH) {
      x = 0; if (f1 == 0 && flag == STB_PATH) len=2;
   } else if (flag & STB_FILE) {
      x = f1;
   } else {
      x = f2;
      if (flag & STB_EXT_NO_PERIOD)
         if (buffer[x] == '.')
            ++x;
   }

   if (flag & STB_EXT)
      y = n;
   else if (flag & STB_FILE)
      y = f2;
   else
      y = f1;

   if (buffer == NULL) {
      buffer = (char *) malloc(y-x + len + 1);
      if (!buffer) return NULL;
   }

   if (len) { strcpy(buffer, "./"); return buffer; }
   strncpy(buffer, path+x, y-x);
   buffer[y-x] = 0;
   return buffer;
}